

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3IndexAffinityOk(Expr *pExpr,char idx_affinity)

{
  char cVar1;
  byte in_SIL;
  Expr *in_RDI;
  char aff;
  undefined4 local_4;
  
  cVar1 = comparisonAffinity(in_RDI);
  if (cVar1 == 'A') {
    local_4 = 1;
  }
  else if (cVar1 == 'B') {
    local_4 = (uint)(in_SIL == 0x42);
  }
  else {
    local_4 = (uint)(0x42 < in_SIL);
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3IndexAffinityOk(Expr *pExpr, char idx_affinity){
  char aff = comparisonAffinity(pExpr);
  switch( aff ){
    case SQLITE_AFF_BLOB:
      return 1;
    case SQLITE_AFF_TEXT:
      return idx_affinity==SQLITE_AFF_TEXT;
    default:
      return sqlite3IsNumericAffinity(idx_affinity);
  }
}